

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_sniffer.cpp
# Opt level: O1

void __thiscall
duckdb::CSVSniffer::CSVSniffer
          (CSVSniffer *this,CSVReaderOptions *options_p,MultiFileOptions *file_options,
          shared_ptr<duckdb::CSVBufferManager,_true> *buffer_manager_p,
          CSVStateMachineCache *state_machine_cache_p,bool default_null_to_varchar_p)

{
  SetColumns *this_00;
  _Rb_tree_header *p_Var1;
  vector<duckdb::LogicalType,_true> *pvVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  CSVReaderOptions *pCVar4;
  element_type *peVar5;
  undefined8 uVar6;
  pointer ppcVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  _Base_ptr p_Var8;
  idx_t iVar9;
  long lVar10;
  CSVErrorHandler *__tmp;
  map<duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>_>_>_>
  *__range1;
  initializer_list<const_char_*> __l;
  initializer_list<const_char_*> __l_00;
  initializer_list<std::pair<const_duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>_>_>
  __l_01;
  allocator_type local_134;
  less<duckdb::LogicalTypeId> local_133;
  allocator_type local_132;
  allocator_type local_131;
  pair<const_duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>_> local_130;
  undefined1 local_110;
  vector<const_char_*,_std::allocator<const_char_*>_> local_108;
  CSVError *local_e0;
  vector<const_char_*,_std::allocator<const_char_*>_> local_d8;
  vector<const_char_*,_std::allocator<const_char_*>_> local_c0;
  char *local_a8;
  char *pcStack_a0;
  char *local_98;
  char *pcStack_90;
  char *local_88;
  char *pcStack_80;
  char *local_78;
  char *local_68;
  char *pcStack_60;
  char *local_58;
  char *pcStack_50;
  char *local_48;
  char *pcStack_40;
  
  this->all_fail_max_line_size = true;
  local_e0 = &this->line_error;
  CSVError::CSVError(local_e0);
  this->state_machine_cache = state_machine_cache_p;
  this->max_columns_found = 0;
  this->max_columns_found_error = 0;
  (this->candidates).
  super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->candidates).
  super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->candidates).
  super_vector<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnCountScanner,_std::default_delete<duckdb::ColumnCountScanner>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->options = options_p;
  this->file_options = file_options;
  (this->buffer_manager).internal.
  super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar5 = (buffer_manager_p->internal).
           super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (buffer_manager_p->internal).
           super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (buffer_manager_p->internal).
  super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->buffer_manager).internal.
  super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
  (this->buffer_manager).internal.
  super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var3;
  (buffer_manager_p->internal).
  super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  this_00 = &this->set_columns;
  SetColumns::SetColumns(this_00);
  (this->detection_error_handler).internal.
  super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->detection_error_handler).internal.
  super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->error_handler).internal.
  super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->error_handler).internal.
  super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->lines_sniffed = 0;
  local_48 = "%Y-%m-%d";
  pcStack_40 = "%y-%m-%d";
  local_58 = "%d-%m-%Y";
  pcStack_50 = "%d-%m-%y";
  local_68 = "%m-%d-%Y";
  pcStack_60 = "%m-%d-%y";
  __l._M_len = 6;
  __l._M_array = &local_68;
  ::std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&local_c0,__l,&local_131);
  local_130.first = DATE;
  ::std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&local_130.second.super_vector<const_char_*,_std::allocator<const_char_*>_>,&local_c0);
  local_78 = "%y-%m-%d %H:%M:%S";
  local_88 = "%d-%m-%y %H:%M:%S";
  pcStack_80 = "%Y-%m-%d %H:%M:%S";
  local_98 = "%m-%d-%y %I:%M:%S %p";
  pcStack_90 = "%d-%m-%Y %H:%M:%S";
  local_a8 = "%Y-%m-%d %H:%M:%S.%f";
  pcStack_a0 = "%m-%d-%Y %I:%M:%S %p";
  __l_00._M_len = 7;
  __l_00._M_array = &local_a8;
  ::std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&local_d8,__l_00,&local_132);
  local_110 = 0x13;
  ::std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&local_108,&local_d8);
  __l_01._M_len = 2;
  __l_01._M_array = &local_130;
  ::std::
  map<duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::vector<const_char_*,_true>_>_>_>
  ::map(&this->format_template_candidates,__l_01,&local_133,&local_134);
  lVar10 = 0x28;
  do {
    if (*(void **)(&local_130.first + lVar10) != (void *)0x0) {
      operator_delete(*(void **)(&local_130.first + lVar10));
    }
    lVar10 = lVar10 + -0x20;
  } while (lVar10 != -0x18);
  if (local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  if (local_c0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  (this->best_sql_types_candidates_per_column_idx)._M_h._M_buckets =
       &(this->best_sql_types_candidates_per_column_idx)._M_h._M_single_bucket;
  (this->best_sql_types_candidates_per_column_idx)._M_h._M_bucket_count = 1;
  (this->best_sql_types_candidates_per_column_idx)._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)0x0;
  (this->best_sql_types_candidates_per_column_idx)._M_h._M_element_count = 0;
  (this->best_sql_types_candidates_per_column_idx)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->best_sql_types_candidates_per_column_idx)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->best_sql_types_candidates_per_column_idx)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->best_format_candidates)._M_t._M_impl.super__Rb_tree_header;
  (this->best_format_candidates)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->best_format_candidates)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->best_format_candidates)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->best_format_candidates)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var1 = &(this->format_candidates)._M_t._M_impl.super__Rb_tree_header;
  (this->format_candidates)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->format_candidates)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->best_format_candidates)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->best_candidate).
  super_unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::StringValueScanner_*,_std::default_delete<duckdb::StringValueScanner>_>
  .super__Head_base<0UL,_duckdb::StringValueScanner_*,_false>._M_head_impl =
       (StringValueScanner *)0x0;
  (this->best_header_row).super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
  super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->best_header_row).super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
  super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->best_header_row).super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
  super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->format_candidates)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->format_candidates)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->format_candidates)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->original_format_candidates)._M_t._M_impl.super__Rb_tree_header;
  (this->original_format_candidates)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->original_format_candidates)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->original_format_candidates)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->original_format_candidates)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->detected_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->detected_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->original_format_candidates)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->detected_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this->default_null_to_varchar = default_null_to_varchar_p;
  (this->manually_set).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->manually_set).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_start.super__Bit_iterator_base + 8) = 0;
  (this->manually_set).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->manually_set).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_finish.super__Bit_iterator_base + 8) = 0;
  (this->manually_set).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       (_Bit_pointer)0x0;
  (this->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->names).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->names).
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  for (p_Var8 = (this->format_template_candidates)._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left;
      (_Rb_tree_header *)p_Var8 !=
      &(this->format_template_candidates)._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var8)) {
    this_01 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)::std::
                 map<duckdb::LogicalTypeId,_duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>_>
                 ::operator[](&this->best_format_candidates,(key_type *)(p_Var8 + 1));
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(this_01);
  }
  pvVar2 = this_00->types;
  if (pvVar2 == (vector<duckdb::LogicalType,_true> *)0x0) {
    iVar9 = 0;
  }
  else {
    iVar9 = ((long)(pvVar2->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
                   .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pvVar2->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>)
                   .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  }
  this->max_columns_found = iVar9;
  local_130._0_8_ = (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::CSVErrorHandler,std::allocator<duckdb::CSVErrorHandler>,bool_const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_130.second,
             (CSVErrorHandler **)&local_130,(allocator<duckdb::CSVErrorHandler> *)&local_a8,
             &(this->options->ignore_errors).value);
  ppcVar7 = local_130.second.super_vector<const_char_*,_std::allocator<const_char_*>_>.
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar6 = local_130._0_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_130.second.super_vector<const_char_*,_std::allocator<const_char_*>_>.
      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)
       ((long)local_130.second.super_vector<const_char_*,_std::allocator<const_char_*>_>.
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start + 8) =
           *(_Atomic_word *)
            ((long)local_130.second.super_vector<const_char_*,_std::allocator<const_char_*>_>.
                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                   super__Vector_impl_data._M_start + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)
       ((long)local_130.second.super_vector<const_char_*,_std::allocator<const_char_*>_>.
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start + 8) =
           *(_Atomic_word *)
            ((long)local_130.second.super_vector<const_char_*,_std::allocator<const_char_*>_>.
                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                   super__Vector_impl_data._M_start + 8) + 1;
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_130.second.super_vector<const_char_*,_std::allocator<const_char_*>_>.
      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_130.second.super_vector<const_char_*,_std::allocator<const_char_*>_>.
               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  (this->error_handler).internal.
  super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar6;
  p_Var3 = (this->error_handler).internal.
           super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  (this->error_handler).internal.
  super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppcVar7;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  local_68 = (char *)CONCAT71(local_68._1_7_,1);
  local_130._0_8_ = (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::CSVErrorHandler,std::allocator<duckdb::CSVErrorHandler>,bool>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_130.second,
             (CSVErrorHandler **)&local_130,(allocator<duckdb::CSVErrorHandler> *)&local_a8,
             (bool *)&local_68);
  ppcVar7 = local_130.second.super_vector<const_char_*,_std::allocator<const_char_*>_>.
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar6 = local_130._0_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_130.second.super_vector<const_char_*,_std::allocator<const_char_*>_>.
      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)
       ((long)local_130.second.super_vector<const_char_*,_std::allocator<const_char_*>_>.
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start + 8) =
           *(_Atomic_word *)
            ((long)local_130.second.super_vector<const_char_*,_std::allocator<const_char_*>_>.
                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                   super__Vector_impl_data._M_start + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)
       ((long)local_130.second.super_vector<const_char_*,_std::allocator<const_char_*>_>.
              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
              super__Vector_impl_data._M_start + 8) =
           *(_Atomic_word *)
            ((long)local_130.second.super_vector<const_char_*,_std::allocator<const_char_*>_>.
                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                   super__Vector_impl_data._M_start + 8) + 1;
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_130.second.super_vector<const_char_*,_std::allocator<const_char_*>_>.
      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_130.second.super_vector<const_char_*,_std::allocator<const_char_*>_>.
               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  (this->detection_error_handler).internal.
  super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar6;
  p_Var3 = (this->detection_error_handler).internal.
           super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  (this->detection_error_handler).internal.
  super___shared_ptr<duckdb::CSVErrorHandler,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppcVar7;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  pCVar4 = this->options;
  if (pCVar4->columns_set == true) {
    SetColumns::SetColumns((SetColumns *)&local_130,&pCVar4->sql_type_list,&pCVar4->name_list);
    this_00->types = (vector<duckdb::LogicalType,_true> *)local_130._0_8_;
    (this->set_columns).names =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)local_130.second.super_vector<const_char_*,_std::allocator<const_char_*>_>.
            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  }
  return;
}

Assistant:

CSVSniffer::CSVSniffer(CSVReaderOptions &options_p, const MultiFileOptions &file_options,
                       shared_ptr<CSVBufferManager> buffer_manager_p, CSVStateMachineCache &state_machine_cache_p,
                       bool default_null_to_varchar_p)
    : state_machine_cache(state_machine_cache_p), options(options_p), file_options(file_options),
      buffer_manager(std::move(buffer_manager_p)), lines_sniffed(0),
      default_null_to_varchar(default_null_to_varchar_p) {
	// Initialize Format Candidates
	for (const auto &format_template : format_template_candidates) {
		auto &logical_type = format_template.first;
		best_format_candidates[logical_type].clear();
	}
	// Initialize max columns found to either 0 or however many were set
	max_columns_found = set_columns.Size();
	error_handler = make_shared_ptr<CSVErrorHandler>(options.ignore_errors.GetValue());
	detection_error_handler = make_shared_ptr<CSVErrorHandler>(true);
	if (options.columns_set) {
		set_columns = SetColumns(&options.sql_type_list, &options.name_list);
	}
}